

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O0

string * __thiscall iDynTree::Traversal::toString_abi_cxx11_(Traversal *this,Model *model)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  Link *pLVar5;
  LinkIndex LVar6;
  IJoint *pIVar7;
  undefined4 extraout_var;
  string *in_RDI;
  size_t i;
  stringstream ss;
  TraversalIndex in_stack_fffffffffffffce8;
  Traversal *in_stack_fffffffffffffcf0;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  ulong local_1b8;
  stringstream local_1a0 [16];
  ostream local_190 [96];
  LinkIndex in_stack_fffffffffffffed0;
  Model *in_stack_fffffffffffffed8;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar4 = std::operator<<(local_190,"Traversal: ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_1b8 = 0;
  while( true ) {
    uVar1 = local_1b8;
    uVar2 = getNrOfVisitedLinks((Traversal *)0x47061c);
    if (uVar2 <= uVar1) break;
    poVar4 = std::operator<<(local_190,"[");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1b8);
    poVar4 = std::operator<<(poVar4,"]\tLink: ");
    pLVar5 = getLink(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    Link::getIndex(pLVar5);
    Model::getLinkName_abi_cxx11_(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    poVar4 = std::operator<<(poVar4,local_1d8);
    poVar4 = std::operator<<(poVar4,"[");
    pLVar5 = getLink(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    LVar6 = Link::getIndex(pLVar5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,LVar6);
    poVar4 = std::operator<<(poVar4,"]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1d8);
    if (local_1b8 != 0) {
      poVar4 = std::operator<<(local_190,"\tJoint to parent : ");
      pIVar7 = getParentJoint(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      (*pIVar7->_vptr_IJoint[0x14])();
      Model::getJointName_abi_cxx11_(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      poVar4 = std::operator<<(poVar4,local_1f8);
      poVar4 = std::operator<<(poVar4,"[");
      pIVar7 = getParentJoint(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      iVar3 = (*pIVar7->_vptr_IJoint[0x14])();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,CONCAT44(extraout_var,iVar3));
      poVar4 = std::operator<<(poVar4,"]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1f8);
      poVar4 = std::operator<<(local_190,"\tParent link     : ");
      pLVar5 = getParentLink(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      Link::getIndex(pLVar5);
      Model::getLinkName_abi_cxx11_(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      poVar4 = std::operator<<(poVar4,local_218);
      poVar4 = std::operator<<(poVar4,"[");
      pLVar5 = getParentLink(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      LVar6 = Link::getIndex(pLVar5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,LVar6);
      in_stack_fffffffffffffcf0 = (Traversal *)std::operator<<(poVar4,"]");
      std::ostream::operator<<(in_stack_fffffffffffffcf0,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_218);
    }
    local_1b8 = local_1b8 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string Traversal::toString(const Model & model) const
{
    std::stringstream ss;

    ss << "Traversal: " << std::endl;
    for(size_t i=0; i < this->getNrOfVisitedLinks(); i++ )
    {
        ss << "[" << i << "]\tLink: " << model.getLinkName(this->getLink(i)->getIndex()) << "[" << this->getLink(i)->getIndex() << "]" << std::endl;
        if( i > 0 )
        {
           ss << "\tJoint to parent : " << model.getJointName(this->getParentJoint(i)->getIndex()) << "[" << this->getParentJoint(i)->getIndex() << "]" << std::endl;
           ss << "\tParent link     : " << model.getLinkName(this->getParentLink(i)->getIndex()) << "[" << this->getParentLink(i)->getIndex() << "]" << std::endl;
        }
    }

    return ss.str();
}